

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void assignment(LexState *ls,LHS_assign *lh,int nvars)

{
  int iVar1;
  undefined1 auStack_58 [4];
  int nexps;
  LHS_assign nv;
  expdesc e;
  int nvars_local;
  LHS_assign *lh_local;
  LexState *ls_local;
  
  if (((lh->v).k < VLOCAL) || (VINDEXED < (lh->v).k)) {
    luaX_syntaxerror(ls,"syntax error");
  }
  iVar1 = testnext(ls,0x2c);
  if (iVar1 == 0) {
    checknext(ls,0x3d);
    iVar1 = explist1(ls,(expdesc *)&nv.v.t);
    if (iVar1 == nvars) {
      luaK_setoneret(ls->fs,(expdesc *)&nv.v.t);
      luaK_storevar(ls->fs,&lh->v,(expdesc *)&nv.v.t);
      return;
    }
    adjust_assign(ls,nvars,iVar1,(expdesc *)&nv.v.t);
    if (nvars < iVar1) {
      ls->fs->freereg = ls->fs->freereg - (iVar1 - nvars);
    }
  }
  else {
    _auStack_58 = lh;
    primaryexp(ls,(expdesc *)&nv);
    if ((int)nv.prev == 6) {
      check_conflict(ls,lh,(expdesc *)&nv);
    }
    if ((int)(200 - (uint)ls->L->nCcalls) < nvars) {
      errorlimit(ls->fs,200 - (uint)ls->L->nCcalls,"variables in assignment");
    }
    assignment(ls,(LHS_assign *)auStack_58,nvars + 1);
  }
  init_exp((expdesc *)&nv.v.t,VNONRELOC,ls->fs->freereg + -1);
  luaK_storevar(ls->fs,&lh->v,(expdesc *)&nv.v.t);
  return;
}

Assistant:

static void assignment(LexState*ls,struct LHS_assign*lh,int nvars){
expdesc e;
check_condition(ls,VLOCAL<=lh->v.k&&lh->v.k<=VINDEXED,
"syntax error");
if(testnext(ls,',')){
struct LHS_assign nv;
nv.prev=lh;
primaryexp(ls,&nv.v);
if(nv.v.k==VLOCAL)
check_conflict(ls,lh,&nv.v);
luaY_checklimit(ls->fs,nvars,200-ls->L->nCcalls,
"variables in assignment");
assignment(ls,&nv,nvars+1);
}
else{
int nexps;
checknext(ls,'=');
nexps=explist1(ls,&e);
if(nexps!=nvars){
adjust_assign(ls,nvars,nexps,&e);
if(nexps>nvars)
ls->fs->freereg-=nexps-nvars;
}
else{
luaK_setoneret(ls->fs,&e);
luaK_storevar(ls->fs,&lh->v,&e);
return;
}
}
init_exp(&e,VNONRELOC,ls->fs->freereg-1);
luaK_storevar(ls->fs,&lh->v,&e);
}